

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_stream_input.cpp
# Opt level: O2

input * mpt::io::stream::input::create(streaminfo *info)

{
  input *this;
  
  this = (input *)operator_new(0x50);
  input(this,info);
  (this->super_input).super_metatype.super_convertable._vptr_convertable =
       (_func_int **)&PTR_convert_0014f560;
  (this->super_stream).super_object._vptr_object = (_func_int **)&PTR_property_0014f5b0;
  (this->super_stream).super_output._vptr_output = (_func_int **)&PTR_push_0014f628;
  (this->super_stream).super_interface._vptr_interface = (_func_int **)&PTR_write_0014f650;
  this[1].super_input.super_metatype.super_convertable._vptr_convertable = (_func_int **)0x1;
  return this;
}

Assistant:

io::stream::input *io::stream::input::create(const streaminfo *info)
{
	class stream_input : public input
	{
	public:
		inline stream_input(const streaminfo *info) : input(info), _ref(1)
		{ }
		void unref() __MPT_OVERRIDE
		{
			if (_ref.lower()) {
				return;
			}
			delete this;
		}
		uintptr_t addref() __MPT_OVERRIDE
		{
			return _ref.raise();
		}
	private:
		refcount _ref;
	};
	return new stream_input(info);
}